

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::findOrCreateShape(SemanticParser *this,SP *pbrtShape)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  pointer psVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar6;
  mapped_type *pmVar7;
  pointer psVar8;
  element_type *peVar9;
  key_type *in_RDX;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  bool bVar13;
  SP SVar14;
  SP SVar15;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  peVar9 = pbrtShape[0x12].super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1 = (in_RDX->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar9 != (element_type *)0x0) {
    p_Var12 = &pbrtShape[0x11].
               super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    peVar10 = (element_type *)p_Var12;
    do {
      bVar13 = *(element_type **)
                ((long)&(peVar9->super_Node).super_ParamSet.param._M_t._M_impl + 0x18) < peVar1;
      if (!bVar13) {
        peVar10 = peVar9;
      }
      peVar9 = *(element_type **)
                (&(((_Rb_tree_header *)
                   ((long)&(peVar9->super_Node).super_ParamSet.param._M_t._M_impl + 8))->_M_header).
                  _M_color + (ulong)bVar13 * 2);
    } while (peVar9 != (element_type *)0x0);
    if ((peVar10 != (element_type *)p_Var12) &&
       (*(element_type **)((long)&(peVar10->super_Node).super_ParamSet.param._M_t._M_impl + 0x18) <=
        peVar1)) {
      pmVar7 = std::
               map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
               ::operator[]((map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
                             *)(pbrtShape + 0x11),in_RDX);
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (pmVar7->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var2 = (pmVar7->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var2;
      _Var11._M_pi = extraout_RDX;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      goto LAB_0013bda2;
    }
  }
  p_Var2 = (in_RDX->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  emitShape(this,pbrtShape);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  pmVar7 = std::
           map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
           ::operator[]((map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
                         *)(pbrtShape + 0x11),in_RDX);
  (pmVar7->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)
       (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var12 = &(this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar7->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
             p_Var12);
  peVar3 = (((in_RDX->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->attributes).
           super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var11._M_pi = extraout_RDX_00;
  if (peVar3 != (element_type *)0x0) {
    *(bool *)((long)&(((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->cameras).
                     super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                     ._M_impl.super__Vector_impl_data + 0x10) = peVar3->reverseOrientation;
    psVar8 = (peVar3->areaLightSources).
             super__Vector_base<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = *(pointer *)
              ((long)&(peVar3->areaLightSources).
                      super__Vector_base<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
                      ._M_impl + 8);
    if (psVar8 != psVar4) {
      if (0x10 < (ulong)((long)psVar4 - (long)psVar8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Warning: Shape has more than one area light!?",0x2d);
        cVar6 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        p_Var12 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ulong)(uint)(int)cVar6;
        std::ostream::put('x');
        std::ostream::flush();
        psVar8 = (peVar3->areaLightSources).
                 super__Vector_base<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      p_Var2 = (psVar8->
               super___shared_ptr<pbrt::syntactic::AreaLightSource,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      SVar14 = parseAreaLight((SemanticParser *)&stack0xffffffffffffffd8,(SP *)p_Var12);
      _Var11 = SVar14.super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      peVar5 = (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = (peVar5->pixelFilter).
                super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (peVar5->pixelFilter).super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)local_28;
      (peVar5->pixelFilter).super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Stack_20._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var11._M_pi = extraout_RDX_01;
      }
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        _Var11._M_pi = extraout_RDX_02;
      }
    }
  }
LAB_0013bda2:
  SVar15.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  SVar15.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar15.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::findOrCreateShape(pbrt::syntactic::Shape::SP pbrtShape)
  {
    if (emittedShapes.find(pbrtShape) != emittedShapes.end())
      return emittedShapes[pbrtShape];

    Shape::SP newShape = emitShape(pbrtShape);
    emittedShapes[pbrtShape] = newShape;

    if (pbrtShape->attributes) {
      newShape->reverseOrientation
        = pbrtShape->attributes->reverseOrientation;
      /* now, add area light sources */
      
      if (!pbrtShape->attributes->areaLightSources.empty()) {
        // std::cout << "Shape has " << pbrtShape->attributes->areaLightSources.size()
        //           << " area light sources..." << std::endl;
        auto &areaLights = pbrtShape->attributes->areaLightSources;
        if (areaLights.size() > 1)
          std::cout << "Warning: Shape has more than one area light!?" << std::endl;
        newShape->areaLight = parseAreaLight(areaLights[0]);
      }
    }

    return newShape;
  }